

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void argo::unparser::save
               (json *j,string *file_name,char *space,char *newline,char *indent,int indent_inc)

{
  bool bVar1;
  json_io_exception *this;
  int *piVar2;
  undefined1 local_280 [8];
  unparser u;
  stream_writer w;
  long local_238;
  ofstream os;
  int indent_inc_local;
  char *indent_local;
  char *newline_local;
  char *space_local;
  string *file_name_local;
  json *j_local;
  
  std::ofstream::ofstream(&local_238,file_name,0x10);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if (!bVar1) {
    this = (json_io_exception *)__cxa_allocate_exception(0xd8);
    piVar2 = __errno_location();
    json_io_exception::json_io_exception(this,file_open_failed_e,*piVar2);
    __cxa_throw(this,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
  }
  stream_writer::stream_writer((stream_writer *)&u.m_indent_inc,(ostream *)&local_238);
  unparser((unparser *)local_280,(writer *)&u.m_indent_inc,space,newline,indent,indent_inc);
  unparse((unparser *)local_280,j,0);
  stream_writer::~stream_writer((stream_writer *)&u.m_indent_inc);
  std::ofstream::~ofstream(&local_238);
  return;
}

Assistant:

void unparser::save(
        const json   &j,
        const string &file_name,
        const char   *space,
        const char   *newline,
        const char   *indent,
        int          indent_inc)
{
    ofstream os(file_name);

    if (os)
    {
        stream_writer w(&os);
        unparser u(w, space, newline, indent, indent_inc);
        u.unparse(j, 0);
    }
    else
    {
        throw json_io_exception(json_io_exception::file_open_failed_e, errno);
    }
}